

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

bool __thiscall BamTools::BamAlignment::GetArrayTagType(BamAlignment *this,string *tag,char *type)

{
  char cVar1;
  ulong uVar2;
  uint *numBytesParsed_00;
  uint *in_RDX;
  char **in_RSI;
  string *in_RDI;
  char elementType;
  uint numBytesParsed;
  uint tagDataLength;
  char *pTagData;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if ((in_RDI[9].field_2._M_local_buf[0] & 1U) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      numBytesParsed_00 = (uint *)std::__cxx11::string::data();
      std::__cxx11::string::size();
      bVar3 = FindTag((BamAlignment *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      in_RDI,in_RSI,in_RDX,numBytesParsed_00);
      if (bVar3) {
        *(char *)in_RDX = *(char *)((long)numBytesParsed_00 + -1);
        if ((char)*in_RDX == 'B') {
          cVar1 = (char)*numBytesParsed_00;
          if ((((cVar1 == 'C') || (cVar1 == 'I')) || (cVar1 == 'S')) ||
             (((cVar1 == 'c' || (cVar1 == 'f')) || ((cVar1 == 'i' || (cVar1 == 's')))))) {
            *(char *)in_RDX = cVar1;
            bVar3 = true;
          }
          else {
            bVar3 = false;
          }
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BamAlignment::GetArrayTagType(const std::string& tag, char& type) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // if tag not found, return failure
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // check that tag type code is array
    type = *(pTagData - 1);
    if (type != Constants::BAM_TAG_TYPE_ARRAY) {
        // TODO: set error string
        return false;
    }

    // fetch element type
    const char elementType = *pTagData;
    switch (elementType) {

        // allowable types
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
            type = elementType;
            break;

        default:
            //TODO: set error string
            return false;
    }

    // if we get here, return success
    return true;
}